

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

string * __thiscall
libtorrent::invalid_request_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,invalid_request_alert *this)

{
  size_t sVar1;
  char *pcVar2;
  string local_1c8;
  char ret [400];
  
  peer_alert::message_abi_cxx11_(&local_1c8,&this->super_peer_alert);
  if (this->withheld == false) {
    if (this->we_have == true) {
      pcVar2 = ": peer is not interested";
      if (this->peer_interested != false) {
        pcVar2 = "";
      }
    }
    else {
      pcVar2 = ": we don\'t have piece";
    }
  }
  else {
    pcVar2 = ": super seeding withheld piece";
  }
  snprintf(ret,400,"%s peer sent an invalid piece request (piece: %d start: %d len: %d)%s",
           local_1c8._M_dataplus._M_p,(ulong)*(uint *)&(this->super_peer_alert).field_0x9c,
           (ulong)*(uint *)&this->field_0xa0,(ulong)*(uint *)&this->field_0xa4,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(ret);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,ret,ret + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string invalid_request_alert::message() const
	{
		char ret[400];
		std::snprintf(ret, sizeof(ret), "%s peer sent an invalid piece request "
			"(piece: %d start: %d len: %d)%s"
			, peer_alert::message().c_str()
			, static_cast<int>(request.piece)
			, request.start
			, request.length
			, withheld ? ": super seeding withheld piece"
			: !we_have ? ": we don't have piece"
			: !peer_interested ? ": peer is not interested"
			: "");
		return ret;
	}